

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

int __thiscall
gl4cts::SparseTexture2LookupTestCase::init(SparseTexture2LookupTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  iterator iVar3;
  pointer extraout_RAX;
  pointer pcVar4;
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  *this_01;
  FunctionToken f;
  undefined1 local_410 [32];
  _Alloc_hider local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_3d0;
  undefined1 local_3a0 [32];
  _Alloc_hider local_380;
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_360;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             mSupportedTargets;
  local_3a0._0_4_ = 0x9100;
  iVar3._M_current =
       (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
       mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
      mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,(int *)local_3a0);
  }
  else {
    *iVar3._M_current = 0x9100;
    (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
    mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  local_3a0._0_4_ = 0x9102;
  iVar3._M_current =
       (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
       mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
      mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,(int *)local_3a0);
  }
  else {
    *iVar3._M_current = 0x9102;
    (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
    mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  local_3a0._0_4_ = 0x81a5;
  iVar3._M_current =
       (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
       mSupportedInternalFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
      mSupportedInternalFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .mSupportedInternalFormats,iVar3,(int *)local_3a0);
  }
  else {
    *iVar3._M_current = 0x81a5;
    (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
    mSupportedInternalFormats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  local_3a0._0_8_ = local_3a0 + 0x10;
  local_3a0._8_8_ = 0;
  local_3a0[0x10] = '\0';
  local_380._M_p = (pointer)&local_370;
  local_378 = 0;
  local_370._M_local_buf[0] = '\0';
  local_360._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_360._M_impl.super__Rb_tree_header._M_header;
  local_360._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_360._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_360._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_360._M_impl.super__Rb_tree_header._M_header._M_right =
       local_360._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"sparseTextureARB","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,0x1b32ab9);
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_50,&local_70);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  puVar2 = local_410 + 0x10;
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  this_01 = &this->mFunctions;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"sparseTextureLodARB","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,", <LOD>","");
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_90,&local_b0);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"sparseTextureOffsetARB","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,", <OFFSET_TYPE><OFFSET_DIM>(0)","");
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_d0,&local_f0);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"sparseTexelFetchARB","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"<LOD_DEF>","");
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_110,&local_130);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x9100;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x9102;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"sparseTexelFetchOffsetARB","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"<LOD_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)","");
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_150,&local_170);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"sparseTextureLodOffsetARB","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,", <LOD>, <OFFSET_TYPE><OFFSET_DIM>(0)","");
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_190,&local_1b0);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"sparseTextureGradARB","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0)",
             "");
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_1d0,&local_1f0);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"sparseTextureGradOffsetARB","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0)"
             ,"");
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_210,&local_230);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"sparseTextureGatherARB","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"<REFZ_DEF>","");
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_250,&local_270);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,"sparseTextureGatherOffsetARB","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,"<REFZ_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)","");
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_290,&local_2b0);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,"sparseTextureGatherOffsetsARB","");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f0,"<REFZ_DEF>, offsetsArray","");
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_2d0,&local_2f0);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(this_01,(value_type *)local_3a0);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"sparseImageLoadARB","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,0x1b32ab9);
  FunctionToken::FunctionToken((FunctionToken *)local_410,&local_310,&local_330);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)local_410);
  std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3f0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&local_360);
  if (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_3d0._M_impl.super__Rb_tree_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3d0._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_node_count =
         local_3d0._M_impl.super__Rb_tree_header._M_node_count;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_3d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_p != &local_3e0) {
    operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_) != puVar2) {
    operator_delete((undefined1 *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_410._0_4_ = 0xde1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8c1a;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x8513;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x9009;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x806f;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x84f5;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x9100;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  local_410._0_4_ = 0x9102;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&local_360,(int *)local_410);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_p != &local_370) {
    operator_delete(local_380._M_p,
                    CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) + 1);
  }
  pcVar4 = local_3a0 + 0x10;
  if ((pointer)local_3a0._0_8_ != pcVar4) {
    operator_delete((void *)local_3a0._0_8_,CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1);
    pcVar4 = extraout_RAX;
  }
  return (int)pcVar4;
}

Assistant:

void SparseTexture2LookupTestCase::init()
{
	SparseTextureCommitmentTestCase::init();
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

	mSupportedInternalFormats.push_back(GL_DEPTH_COMPONENT16);

	FunctionToken f;
	f = FunctionToken("sparseTextureARB", "");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureLodARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureOffsetARB", ", <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTexelFetchARB", "<LOD_DEF>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTexelFetchOffsetARB", "<LOD_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureLodOffsetARB", ", <LOD>, <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradARB", ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradOffsetARB",
					  ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGatherARB", "<REFZ_DEF>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGatherOffsetARB", "<REFZ_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGatherOffsetsARB", "<REFZ_DEF>, offsetsArray");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseImageLoadARB", "");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
	//mFunctions.push_back(f);
}